

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O2

asn_dec_rval_t
NativeEnumerated_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  long *plVar1;
  ulong uVar2;
  int32_t iVar3;
  undefined8 *puVar4;
  ssize_t sVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  asn_dec_rval_t aVar10;
  
  plVar1 = (long *)td->specifics;
  puVar4 = (undefined8 *)*sptr;
  uVar8 = 2;
  if (((constraints == (asn_per_constraints_t *)0x0) &&
      (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) ||
     (plVar1 == (long *)0x0)) goto LAB_00140df6;
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)calloc(1,8);
    *sptr = puVar4;
    if (puVar4 == (undefined8 *)0x0) goto LAB_00140df6;
  }
  uVar9 = 2;
  uVar2 = 1;
  uVar8 = uVar2;
  if (((constraints->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
LAB_00140d77:
    iVar7 = (constraints->value).range_bits;
    if (iVar7 < 0) goto LAB_00140da7;
    iVar3 = per_get_few_bits(pd,iVar7);
    if (iVar3 < 0) goto LAB_00140df6;
    if (*(int *)((long)plVar1 + 0x14) == 0) {
      iVar7 = (int)plVar1[2];
    }
    else {
      iVar7 = *(int *)((long)plVar1 + 0x14) + -1;
    }
    uVar8 = uVar9;
    if (iVar7 <= iVar3) goto LAB_00140df6;
    lVar6 = (long)iVar3;
  }
  else {
    iVar3 = per_get_few_bits(pd,1);
    if (iVar3 < 0) goto LAB_00140df6;
    if (iVar3 == 0) goto LAB_00140d77;
LAB_00140da7:
    uVar8 = uVar9;
    if (((*(int *)((long)plVar1 + 0x14) == 0) ||
        (sVar5 = uper_get_nsnnwn(pd), uVar8 = uVar2, sVar5 < 0)) ||
       (lVar6 = sVar5 + *(int *)((long)plVar1 + 0x14) + -1, uVar8 = uVar9, (int)plVar1[2] <= lVar6))
    goto LAB_00140df6;
  }
  *puVar4 = *(undefined8 *)(*plVar1 + lVar6 * 0x18);
  uVar8 = 0;
LAB_00140df6:
  aVar10.consumed = 0;
  aVar10._0_8_ = uVar8;
  return aVar10;
}

Assistant:

asn_dec_rval_t
NativeEnumerated_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	long *native = (long *)*sptr;
	asn_per_constraint_t *ct;
	long value;

	(void)opt_codec_ctx;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__DECODE_FAILED;	/* Mandatory! */
	if(!specs) ASN__DECODE_FAILED;

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	ASN_DEBUG("Decoding %s as NativeEnumerated", td->name);

	if(ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	if(ct && ct->range_bits >= 0) {
		value = per_get_few_bits(pd, ct->range_bits);
		if(value < 0) ASN__DECODE_STARVED;
		if(value >= (specs->extension
			? specs->extension - 1 : specs->map_count))
			ASN__DECODE_FAILED;
	} else {
		if(!specs->extension)
			ASN__DECODE_FAILED;
		/*
		 * X.691, #10.6: normally small non-negative whole number;
		 */
		value = uper_get_nsnnwn(pd);
		if(value < 0) ASN__DECODE_STARVED;
		value += specs->extension - 1;
		if(value >= specs->map_count)
			ASN__DECODE_FAILED;
	}

	*native = specs->value2enum[value].nat_value;
	ASN_DEBUG("Decoded %s = %ld", td->name, *native);

	return rval;
}